

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int magma_cipher_init_ctr_acpkm_omac(EVP_CIPHER_CTX *ctx,uchar *key,uchar *iv,int enc)

{
  int iVar1;
  long lVar2;
  undefined8 uVar3;
  undefined4 in_ECX;
  uchar *in_RDX;
  EVP_CIPHER_CTX *in_RSI;
  undefined8 in_RDI;
  uchar cipher_key [32];
  uchar *in_stack_00000020;
  ossl_gost_cipher_ctx *c;
  undefined4 in_stack_00000030;
  char *in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  undefined8 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 local_4;
  
  if (in_RSI == (EVP_CIPHER_CTX *)0x0) {
    local_4 = magma_cipher_init((EVP_CIPHER_CTX *)0x0,in_RDX,
                                (uchar *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
  }
  else {
    lVar2 = EVP_CIPHER_CTX_get_cipher_data(in_RDI);
    uVar3 = EVP_MD_CTX_new();
    *(undefined8 *)(lVar2 + 0x1080) = uVar3;
    if (*(long *)(lVar2 + 0x1080) == 0) {
      ERR_GOST_error(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,0
                    );
      local_4 = 0;
    }
    else {
      iVar1 = gost2015_acpkm_omac_init
                        ((int)key,iv._4_4_,(uchar *)CONCAT44(enc,in_stack_00000030),(EVP_MD_CTX *)c,
                         in_stack_00000020,(uchar *)cipher_key._24_8_);
      if (iVar1 == 1) {
        local_4 = magma_cipher_init(in_RSI,in_RDX,
                                    (uchar *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                                    (int)((ulong)lVar2 >> 0x20));
      }
      else {
        EVP_MD_CTX_free(*(undefined8 *)(lVar2 + 0x1080));
        *(undefined8 *)(lVar2 + 0x1080) = 0;
        local_4 = 0;
      }
    }
  }
  return local_4;
}

Assistant:

static int magma_cipher_init_ctr_acpkm_omac(EVP_CIPHER_CTX *ctx, const unsigned char *key,
                      const unsigned char *iv, int enc)
{
	if (key) {
    struct ossl_gost_cipher_ctx *c = EVP_CIPHER_CTX_get_cipher_data(ctx);
		unsigned char cipher_key[32];
		c->omac_ctx = EVP_MD_CTX_new();

		if (c->omac_ctx == NULL) {
		    GOSTerr(GOST_F_MAGMA_CIPHER_INIT_CTR_ACPKM_OMAC, ERR_R_MALLOC_FAILURE);
				return 0;
		}

		if (gost2015_acpkm_omac_init(NID_magma_mac, enc, key,
		                 c->omac_ctx, cipher_key, c->kdf_seed) != 1) {
		    EVP_MD_CTX_free(c->omac_ctx);
				c->omac_ctx = NULL;
		    return 0;
		}

		return magma_cipher_init(ctx, cipher_key, iv, enc);
	}

	return magma_cipher_init(ctx, key, iv, enc);
}